

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall
ocl::KernelSource::exec
          (KernelSource *this,WorkSize *ws,Arg *arg0,Arg *arg1,Arg *arg2,Arg *arg3,Arg *arg4,
          Arg *arg5,Arg *arg6,Arg *arg7,Arg *arg8,Arg *arg9,Arg *arg10,Arg *arg11,Arg *arg12,
          Arg *arg13,Arg *arg14,Arg *arg15,Arg *arg16,Arg *arg17,Arg *arg18,Arg *arg19,Arg *arg20,
          Arg *arg21,Arg *arg22,Arg *arg23,Arg *arg24,Arg *arg25,Arg *arg26,Arg *arg27,Arg *arg28,
          Arg *arg29,Arg *arg30,Arg *arg31,Arg *arg32,Arg *arg33,Arg *arg34,Arg *arg35,Arg *arg36,
          Arg *arg37,Arg *arg38,Arg *arg39,Arg *arg40)

{
  OpenCLKernel *this_00;
  Context local_70;
  Arg *local_58;
  Arg *local_50;
  Context context;
  
  local_70.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ws;
  gpu::Context::Context(&context);
  gpu::Context::cl(&local_70);
  local_58 = arg0;
  local_50 = arg1;
  this_00 = getKernel(this,(shared_ptr<ocl::OpenCLEngine> *)&local_70,false);
  if (local_70.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_70.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  OpenCLKernel::setArgs
            (this_00,local_58,local_50,arg2,arg3,arg4,arg5,arg6,arg7,arg8,arg9,arg10,arg11,arg12,
             arg13,arg14,arg15,arg16,arg17,arg18,arg19,arg20,arg21,arg22,arg23,arg24,arg25,arg26,
             arg27,arg28,arg29,arg30,arg31,arg32,arg33,arg34,arg35,arg36,arg37,arg38,arg39,arg40);
  gpu::Context::cl(&local_70);
  OpenCLEngine::ndRangeKernel
            ((OpenCLEngine *)local_70.data_,this_00,3,(size_t *)0x0,
             (size_t *)
             &local_70.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi[1]._M_use_count,
             (size_t *)
             local_70.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  if (local_70.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_70.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if (context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void KernelSource::exec(const gpu::WorkSize &ws, const Arg &arg0, const Arg &arg1, const Arg &arg2, const Arg &arg3, const Arg &arg4, const Arg &arg5, const Arg &arg6, const Arg &arg7, const Arg &arg8, const Arg &arg9, const Arg &arg10, const Arg &arg11, const Arg &arg12, const Arg &arg13, const Arg &arg14, const Arg &arg15, const Arg &arg16, const Arg &arg17, const Arg &arg18, const Arg &arg19, const Arg &arg20, const Arg &arg21, const Arg &arg22, const Arg &arg23, const Arg &arg24, const Arg &arg25, const Arg &arg26, const Arg &arg27, const Arg &arg28, const Arg &arg29, const Arg &arg30, const Arg &arg31, const Arg &arg32, const Arg &arg33, const Arg &arg34, const Arg &arg35, const Arg &arg36, const Arg &arg37, const Arg &arg38, const Arg &arg39, const Arg &arg40)
{
	gpu::Context context;

	OpenCLKernel *kernel = getKernel(context.cl());

	kernel->setArgs(arg0, arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9, arg10, arg11, arg12, arg13, arg14, arg15, arg16, arg17, arg18, arg19, arg20, arg21, arg22, arg23, arg24, arg25, arg26, arg27, arg28, arg29, arg30, arg31, arg32, arg33, arg34, arg35, arg36, arg37, arg38, arg39, arg40);

	context.cl()->ndRangeKernel(*kernel, 3, NULL, ws.clGlobalSize(), ws.clLocalSize());
}